

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pbVar3;
  pointer pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  undefined1 auVar6 [8];
  char **ppcVar7;
  char *pcVar8;
  bool bVar9;
  ulong uVar10;
  undefined7 extraout_var;
  long *plVar11;
  long lVar12;
  size_type *psVar13;
  long *plVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  size_type sVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  string input;
  string e_2;
  string output;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  string replace;
  string regex;
  RegularExpression re;
  string outvar;
  string local_270;
  string local_250;
  cmCommand *local_230;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [3];
  char **local_110 [13];
  char *local_a8;
  char *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  pcVar4 = pbVar3[2]._M_dataplus._M_p;
  local_230 = &this->super_cmCommand;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar4,pcVar4 + pbVar3[2]._M_string_length);
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  pcVar4 = pbVar3[3]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar4,pcVar4 + pbVar3[3]._M_string_length);
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar4 = pbVar3[4]._M_dataplus._M_p;
  local_1c8 = args;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + pbVar3[4]._M_string_length);
  local_1e8.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  do {
    if (local_1c0._M_string_length <= uVar16) {
      cmMakefile::ClearMatches(local_230->Makefile);
      local_a8 = (char *)0x0;
      bVar9 = cmsys::RegularExpression::compile
                        ((RegularExpression *)local_160,local_1a0._M_dataplus._M_p);
      if (bVar9) {
        local_228._0_8_ =
             (local_1c8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5;
        local_228._8_8_ =
             (local_1c8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_48 = 0;
        local_40 = '\0';
        local_50 = &local_40;
        cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&local_270,
                   (Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_228,&local_40);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        local_228._0_8_ = local_228 + 0x10;
        local_228._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_228[0x10] = '\0';
        paVar1 = &local_250.field_2;
        lVar20 = 0;
        goto LAB_0028297f;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     "sub-command REGEX, mode REPLACE failed to compile regex \"",&local_1a0);
      plVar11 = (long *)std::__cxx11::string::append(local_228);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_270.field_2._M_allocated_capacity = *psVar13;
        local_270.field_2._8_8_ = plVar11[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar13;
        local_270._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_270._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
      }
      cmCommand::SetError(local_230,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      bVar17 = 0;
      goto LAB_00282f29;
    }
    uVar10 = std::__cxx11::string::find((char *)&local_1c0,0x50cfbb,uVar16);
    sVar19 = local_1c0._M_string_length;
    if (uVar10 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_1c0);
      local_160._0_4_ = 0xffffffff;
      local_158._M_p = (pointer)local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_270._M_dataplus._M_p,
                 local_270._M_dataplus._M_p + local_270._M_string_length);
      std::
      vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
      ::emplace_back<cmStringCommand::RegexReplacement>(&local_1e8,(RegexReplacement *)local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_p != local_148) {
        operator_delete(local_158._M_p,
                        CONCAT71(local_148[0]._M_allocated_capacity._1_7_,
                                 local_148[0]._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
LAB_00282822:
      bVar9 = true;
      uVar16 = sVar19;
    }
    else {
      if (uVar10 != uVar16) {
        std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_1c0);
        local_160._0_4_ = 0xffffffff;
        local_158._M_p = (pointer)local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_270._M_dataplus._M_p,
                   local_270._M_dataplus._M_p + local_270._M_string_length);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::emplace_back<cmStringCommand::RegexReplacement>(&local_1e8,(RegexReplacement *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_p != local_148) {
          operator_delete(local_158._M_p,
                          CONCAT71(local_148[0]._M_allocated_capacity._1_7_,
                                   local_148[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
      }
      if (uVar10 != local_1c0._M_string_length - 1) {
        cVar2 = local_1c0._M_dataplus._M_p[uVar10 + 1];
        if ((byte)(cVar2 - 0x30U) < 10) {
          local_160._0_4_ = local_1c0._M_dataplus._M_p[uVar10 + 1] + -0x30;
          local_150 = (char *)0x0;
          local_148[0]._M_local_buf[0] = '\0';
          local_158._M_p = (pointer)local_148;
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_1e8,(RegexReplacement *)local_160);
        }
        else if (cVar2 == '\\') {
          local_160._0_4_ = 0xffffffff;
          local_158._M_p = (pointer)local_148;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"\\","");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_1e8,(RegexReplacement *)local_160);
        }
        else {
          if (cVar2 != 'n') {
            local_160 = (undefined1  [8])&local_150;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"sub-command REGEX, mode REPLACE: Unknown escape \"","");
            std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_1c0);
            std::__cxx11::string::_M_append((char *)local_160,(ulong)local_270._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)local_160);
            cmCommand::SetError(local_230,(string *)local_160);
            goto LAB_00282656;
          }
          local_160._0_4_ = 0xffffffff;
          local_158._M_p = (pointer)local_148;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"\n","");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_1e8,(RegexReplacement *)local_160);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_p != local_148) {
          operator_delete(local_158._M_p,
                          CONCAT71(local_148[0]._M_allocated_capacity._1_7_,
                                   local_148[0]._M_local_buf[0]) + 1);
        }
        sVar19 = uVar10 + 2;
        goto LAB_00282822;
      }
      local_160 = (undefined1  [8])&local_150;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,
                 "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.","");
      cmCommand::SetError(local_230,(string *)local_160);
LAB_00282656:
      if (local_160 != (undefined1  [8])&local_150) {
        operator_delete((void *)local_160,(ulong)(local_150 + 1));
      }
      bVar9 = false;
    }
  } while (bVar9);
  bVar17 = 0;
  goto LAB_00282f3b;
LAB_0028297f:
  do {
    bVar9 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_160,local_270._M_dataplus._M_p + lVar20);
    local_1c8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(local_1c8._4_4_,(int)CONCAT71(extraout_var,bVar9));
    if (!bVar9) {
      std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_270);
      std::__cxx11::string::_M_append(local_228,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::AddDefinition(local_230->Makefile,&local_90,(char *)local_228._0_8_);
      break;
    }
    cmMakefile::StoreMatches(local_230->Makefile,(RegularExpression *)local_160);
    pcVar8 = local_98;
    ppcVar7 = local_110[0];
    auVar6 = local_160;
    std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_270);
    std::__cxx11::string::_M_append(local_228,(ulong)local_250._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1  [8])ppcVar7 == auVar6) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,"sub-command REGEX, mode REPLACE regex \"",&local_1a0);
      plVar11 = (long *)std::__cxx11::string::append(local_208._M_local_buf);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_250.field_2._M_allocated_capacity = *psVar13;
        local_250.field_2._8_8_ = plVar11[3];
        local_250._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_250.field_2._M_allocated_capacity = *psVar13;
        local_250._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_250._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_allocated_capacity != &local_1f8) {
        operator_delete((void *)local_208._M_allocated_capacity,local_1f8._M_allocated_capacity + 1)
        ;
      }
      cmCommand::SetError(local_230,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      bVar9 = false;
    }
    else {
      lVar18 = (long)ppcVar7 - (long)pcVar8;
      bVar9 = local_1e8.
              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1e8.
              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar9) {
        uVar16 = 0;
        uVar10 = 1;
        do {
          lVar12 = (long)local_1e8.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].number;
          if (lVar12 < 0) {
            std::__cxx11::string::_M_append
                      (local_228,
                       (ulong)local_1e8.
                              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].value._M_dataplus.
                              _M_p);
          }
          else {
            if ((((*(long *)(local_160 + lVar12 * 8) - (long)local_98 == 0xffffffffffffffff) ||
                 ((long)local_110[lVar12] - (long)local_98 == 0xffffffffffffffff)) ||
                (local_270._M_string_length - lVar20 <
                 (ulong)(*(long *)(local_160 + lVar12 * 8) - (long)local_98))) ||
               (local_270._M_string_length - lVar20 <
                (ulong)((long)local_110[lVar12] - (long)local_98))) {
              std::operator+(&local_70,"sub-command REGEX, mode REPLACE: replace expression \"",
                             &local_1c0);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_70);
              local_180 = &local_170;
              plVar14 = plVar11 + 2;
              if ((long *)*plVar11 == plVar14) {
                local_170 = *plVar14;
                lStack_168 = plVar11[3];
              }
              else {
                local_170 = *plVar14;
                local_180 = (long *)*plVar11;
              }
              local_178 = plVar11[1];
              *plVar11 = (long)plVar14;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_180,(ulong)local_1a0._M_dataplus._M_p);
              local_208._M_allocated_capacity = (size_type)&local_1f8;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar15) {
                local_1f8._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_1f8._8_8_ = plVar11[3];
              }
              else {
                local_1f8._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_208._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar11;
              }
              local_208._8_8_ = plVar11[1];
              *plVar11 = (long)paVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append(local_208._M_local_buf);
              psVar13 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_250.field_2._M_allocated_capacity = *psVar13;
                local_250.field_2._8_8_ = plVar11[3];
                local_250._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar13;
                local_250._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_250._M_string_length = plVar11[1];
              *plVar11 = (long)psVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_allocated_capacity != &local_1f8) {
                operator_delete((void *)local_208._M_allocated_capacity,
                                local_1f8._M_allocated_capacity + 1);
              }
              if (local_180 != &local_170) {
                operator_delete(local_180,local_170 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              cmCommand::SetError(local_230,&local_250);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != paVar1) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              lVar18 = 0;
              break;
            }
            std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_270);
            std::__cxx11::string::_M_append(local_228,(ulong)local_250._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != paVar1) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar16 = ((long)local_1e8.
                          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e8.
                          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          bVar21 = uVar16 < uVar10;
          bVar22 = uVar16 - uVar10 == 0;
          bVar9 = bVar21 || bVar22;
          uVar16 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (!bVar21 && !bVar22);
      }
      lVar20 = lVar20 + lVar18;
    }
  } while (bVar9);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
  }
  pvVar5 = local_1c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  bVar17 = (byte)pvVar5 ^ 1;
LAB_00282f29:
  if (local_a8 != (char *)0x0) {
    operator_delete__(local_a8);
  }
LAB_00282f3b:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return (bool)bVar17;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string regex = args[2];
  std::string replace = args[3];
  std::string outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while(l < replace.length())
    {
    std::string::size_type r = replace.find("\\", l);
    if(r == std::string::npos)
      {
      r = replace.length();
      replacement.push_back(replace.substr(l, r-l));
      }
    else
      {
      if(r-l > 0)
        {
        replacement.push_back(replace.substr(l, r-l));
        }
      if(r == (replace.length()-1))
        {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
        }
      if((replace[r+1] >= '0') && (replace[r+1] <= '9'))
        {
        replacement.push_back(replace[r+1]-'0');
        }
      else if(replace[r+1] == 'n')
        {
        replacement.push_back("\n");
        }
      else if(replace[r+1] == '\\')
        {
        replacement.push_back("\\");
        }
      else
        {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
        }
      r += 2;
      }
    l = r;
    }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while(re.find(input.c_str()+base))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if(r-l2 == 0)
      {
      std::string e = "sub-command REGEX, mode REPLACE regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }

    // Concatenate the replacement for the match.
    for(unsigned int i=0; i < replacement.size(); ++i)
      {
      if(replacement[i].number < 0)
        {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
        }
      else
        {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length()-base;
        if((start != std::string::npos) && (end != std::string::npos) &&
           (start <= len) && (end <= len))
          {
          output += input.substr(base+start, end-start);
          }
        else
          {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \""+
            replace+"\" contains an out-of-range escape for regex \""+
            regex+"\".";
          this->SetError(e);
          return false;
          }
        }
      }

    // Move past the match.
    base += r;
    }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length()-base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}